

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidget::setPalette(QWidget *this,QPalette *palette)

{
  uint uVar1;
  QWidgetPrivate *this_00;
  long lVar2;
  long in_FS_OFFSET;
  undefined1 local_48 [16];
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  lVar2 = QPalette::resolveMask();
  uVar1 = *(uint *)(*(long *)&this->field_0x8 + 0x240);
  if ((lVar2 != 0) != SUB41((uVar1 & 0x10) >> 4,0)) {
    *(uint *)(*(long *)&this->field_0x8 + 0x240) = (uint)(lVar2 != 0) << 4 | uVar1 & 0xffffffef;
  }
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  QWidgetPrivate::naturalWidgetPalette((QWidgetPrivate *)&local_38,(ResolveMask)this_00);
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QPalette::resolve((QPalette *)local_48);
  QWidgetPrivate::setPalette_helper(this_00,(QPalette *)local_48);
  QPalette::~QPalette((QPalette *)local_48);
  QPalette::~QPalette((QPalette *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidget::setPalette(const QPalette &palette)
{
    Q_D(QWidget);
    setAttribute(Qt::WA_SetPalette, palette.resolveMask() != 0);

    // Determine which palette is inherited from this widget's ancestors and
    // QApplication::palette, resolve this against \a palette (attributes from
    // the inherited palette are copied over this widget's palette). Then
    // propagate this palette to this widget's children.
    QPalette naturalPalette = d->naturalWidgetPalette(d->inheritedPaletteResolveMask);
    QPalette resolvedPalette = palette.resolve(naturalPalette);
    d->setPalette_helper(resolvedPalette);
}